

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O1

void list_split_list(t_list_split *x,t_symbol *s,int argc,t_atom *argv)

{
  long lVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (0 < (int)x->x_f) {
    uVar2 = (int)x->x_f;
  }
  lVar1 = 0x48;
  if ((int)uVar2 <= argc) {
    outlet_list(x->x_out2,&s_list,argc - uVar2,argv + uVar2);
    lVar1 = 0x38;
    argc = uVar2;
  }
  outlet_list(*(_outlet **)((long)&(x->x_obj).te_g.g_pd + lVar1),&s_list,argc,argv);
  return;
}

Assistant:

static void list_split_list(t_list_split *x, t_symbol *s,
    int argc, t_atom *argv)
{
    int n = x->x_f;
    if (n < 0)
        n = 0;
    if (argc >= n)
    {
        outlet_list(x->x_out2, &s_list, argc-n, argv+n);
        outlet_list(x->x_out1, &s_list, n, argv);
    }
    else outlet_list(x->x_out3, &s_list, argc, argv);
}